

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall sznet::net::TcpServer::removeConnection(TcpServer *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  TcpServer *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_38;
  TcpConnectionPtr *local_18;
  TcpConnectionPtr *conn_local;
  TcpServer *this_local;
  
  this_00 = this->m_loop;
  local_70 = removeConnectionInLoop;
  local_68 = 0;
  local_78 = this;
  local_18 = conn;
  conn_local = (TcpConnectionPtr *)this;
  std::
  bind<void(sznet::net::TcpServer::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>const&>
            (&local_60,(offset_in_TcpServer_to_subr *)&local_70,&local_78,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void()> *)&local_38,&local_60);
  EventLoop::runInLoop(this_00,&local_38);
  std::function<void_()>::~function(&local_38);
  std::
  _Bind<void_(sznet::net::TcpServer::*(sznet::net::TcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  ::~_Bind(&local_60);
  return;
}

Assistant:

void TcpServer::removeConnection(const TcpConnectionPtr& conn)
{
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&TcpServer::removeConnectionInLoop, this, conn));
}